

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O0

int __thiscall
EmulNet::ENrecv(EmulNet *this,Address *myaddr,_func_int_void_ptr_char_ptr_int *enq,timeval *t,
               int times,void *queue)

{
  en_msg *__ptr;
  int iVar1;
  int iVar2;
  char *__dest;
  int time;
  int dst;
  en_msg *emsg;
  int sz;
  char *tmp;
  int i;
  void *queue_local;
  int times_local;
  timeval *t_local;
  _func_int_void_ptr_char_ptr_int *enq_local;
  Address *myaddr_local;
  EmulNet *this_local;
  
  tmp._4_4_ = (this->emulnet).currbuffsize;
  while( true ) {
    do {
      tmp._4_4_ = tmp._4_4_ + -1;
      if (tmp._4_4_ < 0) {
        return 0;
      }
      __ptr = (this->emulnet).buff[tmp._4_4_];
      iVar1 = strcmp((__ptr->to).addr,myaddr->addr);
    } while (iVar1 != 0);
    iVar1 = __ptr->size;
    __dest = (char *)malloc((long)iVar1);
    memcpy(__dest,__ptr + 1,(long)iVar1);
    (this->emulnet).buff[tmp._4_4_] = (this->emulnet).buff[(this->emulnet).currbuffsize + -1];
    (this->emulnet).currbuffsize = (this->emulnet).currbuffsize + -1;
    (*enq)(queue,__dest,iVar1);
    free(__ptr);
    iVar1 = *(int *)myaddr->addr;
    iVar2 = Params::getcurrtime(this->par);
    if (1000 < iVar1) break;
    if (0xe0f < iVar2) {
      __assert_fail("time < MAX_TIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/justintumale[P]membership_protocol/mp1/EmulNet.cpp"
                    ,0xaa,
                    "int EmulNet::ENrecv(Address *, int (*)(void *, char *, int), struct timeval *, int, void *)"
                   );
    }
    this->recv_msgs[iVar1][iVar2] = this->recv_msgs[iVar1][iVar2] + 1;
  }
  __assert_fail("dst <= MAX_NODES",
                "/workspace/llm4binary/github/license_all_cmakelists_25/justintumale[P]membership_protocol/mp1/EmulNet.cpp"
                ,0xa9,
                "int EmulNet::ENrecv(Address *, int (*)(void *, char *, int), struct timeval *, int, void *)"
               );
}

Assistant:

int EmulNet::ENrecv(Address *myaddr, int (* enq)(void *, char *, int), struct timeval *t, int times, void *queue){
	// times is always assumed to be 1
	int i;
	char* tmp;
	int sz;
	en_msg *emsg;

	for( i = emulnet.currbuffsize - 1; i >= 0; i-- ) {
		emsg = emulnet.buff[i];

		if ( 0 == strcmp(emsg->to.addr, myaddr->addr) ) {
			sz = emsg->size;
			tmp = (char *) malloc(sz * sizeof(char));
			memcpy(tmp, (char *)(emsg+1), sz);

			emulnet.buff[i] = emulnet.buff[emulnet.currbuffsize-1];
			emulnet.currbuffsize--;

			(*enq)(queue, (char *)tmp, sz);

			free(emsg);

			int dst = *(int *)(myaddr->addr);
			int time = par->getcurrtime();

			assert(dst <= MAX_NODES);
			assert(time < MAX_TIME);

			recv_msgs[dst][time]++;
		}
	}

	return 0;
}